

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O0

void __thiscall despot::BaseTag::ComputeDefaultActions(BaseTag *this,string *type)

{
  value_type vVar1;
  bool bVar2;
  int iVar3;
  ACT_TYPE AVar4;
  const_reference pvVar5;
  reference pvVar6;
  const_reference pvVar7;
  ostream *poVar8;
  double dVar9;
  double dVar10;
  double dist;
  int next;
  int a;
  double cur_dist;
  int local_20;
  int s_1;
  int s;
  int num_states;
  string *type_local;
  BaseTag *this_local;
  
  bVar2 = std::operator==(type,"MDP");
  if (bVar2) {
    (**(code **)(*(long *)this + 0x30))();
    iVar3 = (**(code **)(*(long *)this + 0x10))();
    std::vector<int,_std::allocator<int>_>::resize(&this->default_action_,(long)iVar3);
    for (local_20 = 0; local_20 < iVar3; local_20 = local_20 + 1) {
      pvVar5 = std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::operator[]
                         ((vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> *)
                          &this->field_0x8,(long)local_20);
      vVar1 = *(value_type *)pvVar5;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->default_action_,(long)local_20);
      *pvVar6 = vVar1;
    }
  }
  else {
    bVar2 = std::operator==(type,"SP");
    if (!bVar2) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Unsupported default action type ");
      poVar8 = std::operator<<(poVar8,(string *)type);
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      exit(1);
    }
    iVar3 = (**(code **)(*(long *)this + 0x10))();
    std::vector<int,_std::allocator<int>_>::resize(&this->default_action_,(long)iVar3);
    for (cur_dist._4_4_ = 0; iVar3 = (**(code **)(*(long *)this + 0x10))(), cur_dist._4_4_ < iVar3;
        cur_dist._4_4_ = cur_dist._4_4_ + 1) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->default_action_,(long)cur_dist._4_4_);
      *pvVar6 = 0;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&this->rob_,(long)cur_dist._4_4_);
      iVar3 = *pvVar7;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&this->opp_,(long)cur_dist._4_4_);
      if (iVar3 == *pvVar7) {
        AVar4 = TagAction(this);
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->default_action_,(long)cur_dist._4_4_);
        *pvVar6 = AVar4;
      }
      else {
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->rob_,(long)cur_dist._4_4_);
        iVar3 = *pvVar7;
        std::vector<int,_std::allocator<int>_>::operator[](&this->opp_,(long)cur_dist._4_4_);
        dVar9 = (double)despot::Floor::Distance((int)this + 0x58,iVar3);
        for (dist._4_4_ = 0; dist._4_4_ < 4; dist._4_4_ = dist._4_4_ + 1) {
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&this->rob_,(long)cur_dist._4_4_);
          iVar3 = NextRobPosition(this,*pvVar7,dist._4_4_);
          std::vector<int,_std::allocator<int>_>::operator[](&this->opp_,(long)cur_dist._4_4_);
          dVar10 = (double)despot::Floor::Distance((int)this + 0x58,iVar3);
          if (dVar10 < dVar9) {
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&this->default_action_,(long)cur_dist._4_4_);
            *pvVar6 = dist._4_4_;
            break;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void BaseTag::ComputeDefaultActions(string type) const {
	if (type == "MDP") {
		const_cast<BaseTag*>(this)->ComputeOptimalPolicyUsingVI();
		int num_states = NumStates();
		default_action_.resize(num_states);

		for (int s = 0; s < num_states; s++) {
			default_action_[s] = policy_[s].action;
		}
	} else if (type == "SP") {
		// Follow the shortest path from the robot to the opponent
		default_action_.resize(NumStates());
		for (int s = 0; s < NumStates(); s++) {
			default_action_[s] = 0;
			if (rob_[s] == opp_[s]) {
				default_action_[s] = TagAction();
			} else {
				double cur_dist = floor_.Distance(rob_[s], opp_[s]);
				for (int a = 0; a < 4; a++) {
					int next = NextRobPosition(rob_[s], a);
					double dist = floor_.Distance(next, opp_[s]);

					if (dist < cur_dist) {
						default_action_[s] = a;
						break;
					}
				}
			}
		}
	} else {
		cerr << "Unsupported default action type " << type << endl;
		exit(1);
	}
}